

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_action(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_action **actions)

{
  lysp_node_action *plVar1;
  uint16_t uVar2;
  LY_ERR LVar3;
  lysp_node_action *parent_00;
  char *pcVar4;
  ly_stmt parent_stmt;
  char *pcVar5;
  ly_ctx *local_108;
  ly_ctx *local_100;
  ly_ctx *local_f0;
  ly_ctx *local_d8;
  char *local_d0;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_70;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_action *act;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node_action **pplStack_28;
  LY_ERR ret;
  lysp_node_action **actions_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = actions;
  actions_local = (lysp_node_action **)parent;
  parent_local = (lysp_node *)ctx;
  parent_00 = (lysp_node_action *)calloc(1,0x110);
  if (parent_00 == (lysp_node_action *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_b0 = (ly_ctx *)0x0;
    }
    else {
      local_b0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    ly_log(local_b0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_action");
    return LY_EMEM;
  }
  if (*pplStack_28 == (lysp_node_action *)0x0) {
    *pplStack_28 = parent_00;
  }
  else {
    plVar1 = *pplStack_28;
    while (plStack_70 = (long *)((long)plVar1 + (long)*pplStack_28 + (0x10 - (long)*pplStack_28)),
          *plStack_70 != 0) {
      plVar1 = (lysp_node_action *)*plStack_70;
    }
    *plStack_70 = (long)parent_00;
  }
  LVar3 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_d0 = "";
    }
    else {
      local_d0 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_c0,local_d0,sStack_48,&(parent_00->field_0).node.name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_b8 = (ly_ctx *)0x0;
    }
    else {
      local_b8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_b8,(char *)word_len,&(parent_00->field_0).node.name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    uVar2 = 0x100;
    if ((lysp_node *)actions_local != (lysp_node *)0x0) {
      uVar2 = 0x200;
    }
    (parent_00->field_0).node.nodetype = uVar2;
    (parent_00->field_0).node.parent = (lysp_node *)actions_local;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&act + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (act._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar3 = buf._4_4_;
      }
      else {
        if (act._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_d8 = (ly_ctx *)0x0;
          }
          else {
            local_d8 = *(ly_ctx **)
                        **(undefined8 **)
                          (parent_local->exts->argument +
                          (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar4 = lyplg_ext_stmt2str(act._4_4_);
          ly_vlog(local_d8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
          return LY_EVALID;
        }
        LVar3 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&act + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        ret___2._3_1_ = act._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar3 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar3, !(bool)ret___2._3_1_) {
        if (act._4_4_ == LY_STMT_INPUT) {
          LVar3 = parse_inout((lysp_yang_ctx *)parent_local,LY_STMT_INPUT,(lysp_node *)parent_00,
                              &parent_00->input);
        }
        else if (act._4_4_ == LY_STMT_OUTPUT) {
          LVar3 = parse_inout((lysp_yang_ctx *)parent_local,LY_STMT_OUTPUT,(lysp_node *)parent_00,
                              &parent_00->output);
        }
        else if (act._4_4_ == LY_STMT_GROUPING) {
          LVar3 = parse_grouping((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                 &parent_00->groupings);
        }
        else if (act._4_4_ == LY_STMT_DESCRIPTION) {
          LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,(parent_00->field_0).node.dsc,
                                   LY_STMT_DESCRIPTION,0,&(parent_00->field_0).node.dsc,Y_STR_ARG,
                                   (uint16_t *)0x0,&(parent_00->field_0).node.exts);
        }
        else if (act._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
          parent_stmt = LY_STMT_RPC;
          if (actions_local != (lysp_node_action **)0x0) {
            parent_stmt = LY_STMT_ACTION;
          }
          LVar3 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,parent_00,
                            parent_stmt,0,&(parent_00->field_0).node.exts);
        }
        else if (act._4_4_ == LY_STMT_IF_FEATURE) {
          LVar3 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_IF_FEATURE,
                               &(parent_00->field_0).node.iffeatures,Y_STR_ARG,
                               &(parent_00->field_0).node.exts);
        }
        else if (act._4_4_ == LY_STMT_REFERENCE) {
          LVar3 = parse_text_field((lysp_yang_ctx *)parent_local,(parent_00->field_0).node.ref,
                                   LY_STMT_REFERENCE,0,&(parent_00->field_0).node.ref,Y_STR_ARG,
                                   (uint16_t *)0x0,&(parent_00->field_0).node.exts);
        }
        else if (act._4_4_ == LY_STMT_STATUS) {
          LVar3 = parse_status((lysp_yang_ctx *)parent_local,&(parent_00->field_0).node.flags,
                               &(parent_00->field_0).node.exts);
        }
        else {
          if (act._4_4_ != LY_STMT_TYPEDEF) {
            if (parent_local == (lysp_node *)0x0) {
              local_f0 = (ly_ctx *)0x0;
            }
            else {
              local_f0 = *(ly_ctx **)
                          **(undefined8 **)
                            (parent_local->exts->argument +
                            (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            pcVar4 = lyplg_ext_stmt2str(act._4_4_);
            pcVar5 = "rpc";
            if (actions_local != (lysp_node_action **)0x0) {
              pcVar5 = "action";
            }
            ly_vlog(local_f0,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar5);
            return LY_EVALID;
          }
          LVar3 = parse_typedef((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                &parent_00->typedefs);
        }
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&act + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar3 = LY_SUCCESS;
        if (act._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if (((parent_00->field_0).node.exts != (lysp_ext_instance *)0x0) &&
             (LVar3 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,
                                 (parent_00->field_0).node.exts,'\x01',(uint32_t *)0x0),
             LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
          buf._4_4_ = LVar3;
          ret___2._3_1_ = true;
          LVar3 = buf._4_4_;
        }
      }
      if ((parent_00->input).field_0.node.nodetype == 0) {
        (parent_00->input).field_0.node.nodetype = 0x1000;
        (parent_00->input).field_0.node.parent = (lysp_node *)parent_00;
        if (parent_local == (lysp_node *)0x0) {
          local_100 = (ly_ctx *)0x0;
        }
        else {
          local_100 = *(ly_ctx **)
                       **(undefined8 **)
                         (parent_local->exts->argument +
                         (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        LVar3 = lydict_insert(local_100,"input",0,&(parent_00->input).field_0.node.name);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
      }
      if ((parent_00->output).field_0.node.nodetype == 0) {
        (parent_00->output).field_0.node.nodetype = 0x2000;
        (parent_00->output).field_0.node.parent = (lysp_node *)parent_00;
        if (parent_local == (lysp_node *)0x0) {
          local_108 = (ly_ctx *)0x0;
        }
        else {
          local_108 = *(ly_ctx **)
                       **(undefined8 **)
                         (parent_local->exts->argument +
                         (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
        }
        LVar3 = lydict_insert(local_108,"output",0,&(parent_00->output).field_0.node.name);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_action(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_action **actions)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_action *act;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), actions, act, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, act->name, word, word_len, ret, cleanup);
    act->nodetype = parent ? LYS_ACTION : LYS_RPC;
    act->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, act->dsc, LY_STMT_DESCRIPTION, 0, &act->dsc, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &act->iffeatures, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, act->ref, LY_STMT_REFERENCE, 0, &act->ref, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &act->flags, &act->exts));
            break;

        case LY_STMT_INPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->input));
            break;
        case LY_STMT_OUTPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->output));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)act, &act->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)act, &act->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, act, parent ? LY_STMT_ACTION : LY_STMT_RPC, 0, &act->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), parent ? "action" : "rpc");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, act->exts, ret, cleanup);
    }

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

cleanup:
    return ret;
}